

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

void sx_strpool_destroy(sx_strpool *sp,sx_alloc *alloc)

{
  code *pcVar1;
  
  if (sp != (sx_strpool *)0x0) {
    strpool_term(sp);
    (*alloc->alloc_cb)(sp,0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
    return;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                    0x308,"sp");
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void sx_strpool_destroy(sx_strpool* sp, const sx_alloc* alloc)
{
    sx_assert(sp);
    strpool_term(sp);
    sx_free(alloc, sp);
}